

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::Image(Image *this,string *path)

{
  byte bVar1;
  ulong uVar2;
  undefined4 uVar3;
  uint uVar4;
  runtime_error *prVar5;
  char *pcVar6;
  size_type sVar7;
  byte *pbVar8;
  iterator __first;
  iterator __last;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_300;
  undefined1 local_2d0 [8];
  rgba_vec_t rgba_v;
  uint local_2b0;
  uint32_t color;
  uint i_2;
  uint pack_shift;
  uint i_1;
  uint i;
  index_t mask;
  uint ppb;
  uint depth;
  char local_271;
  undefined1 local_270 [7];
  bool needs_conversion;
  State state;
  uint local_38;
  uint error;
  uint h;
  uint w;
  byte_vec_t buffer;
  string *path_local;
  Image *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)path;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_indexed_data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_palette);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->_colors);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&h);
  uVar4 = lodepng::load_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&h,
                             (string *)
                             buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (uVar4 != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar6 = lodepng_error_text(uVar4);
    std::runtime_error::runtime_error(prVar5,pcVar6);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lodepng::State::State((State *)local_270);
  state.super_LodePNGState.decoder.ignore_critical = 0;
  state.super_LodePNGState.decoder.zlibsettings.custom_context._0_4_ = 1;
  uVar4 = lodepng::decode(&this->_data,&error,&local_38,(State *)local_270,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&h);
  if (uVar4 == 0) {
    local_271 = '\0';
    if (state.super_LodePNGState.encoder.text_compression == 3) {
      if ((state.super_LodePNGState.encoder._84_4_ == 0) ||
         (7 < (uint)state.super_LodePNGState.encoder._84_4_)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this->_indexed_data,&this->_data);
      }
      else {
        uVar4 = error * local_38;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&ppb + 3));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&depth,(ulong)uVar4,
                   (allocator<unsigned_char> *)((long)&ppb + 3));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this->_indexed_data,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&depth);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&depth);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&ppb + 3));
        uVar3 = state.super_LodePNGState.encoder._84_4_;
        uVar2 = (ulong)(uint)state.super_LodePNGState.encoder._84_4_;
        i_1._3_1_ = 0;
        for (pack_shift = 0; pack_shift < (uint)state.super_LodePNGState.encoder._84_4_;
            pack_shift = pack_shift + 1) {
          i_1._3_1_ = i_1._3_1_ * '\x02' + 1;
        }
        for (i_2 = 0; sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        (&this->_indexed_data), i_2 < sVar7; i_2 = i_2 + 1) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->_data,(ulong)i_2 / (8 / uVar2));
          bVar1 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->_indexed_data,(ulong)i_2);
          *pbVar8 = i_1._3_1_ &
                    (byte)((int)(uint)bVar1 >>
                          (('\b' - (char)uVar3) - ((char)i_2 * (char)uVar3 & 7U) & 0x1f));
        }
      }
      for (local_2b0 = 0;
          (ulong)local_2b0 < (ulong)((long)state.super_LodePNGState.info_raw.palette << 2);
          local_2b0 = local_2b0 + 4) {
        rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             CONCAT13(*(undefined1 *)
                       (state.super_LodePNGState.info_raw._0_8_ + (ulong)(local_2b0 + 3)),
                      CONCAT12(*(undefined1 *)
                                (state.super_LodePNGState.info_raw._0_8_ + (ulong)(local_2b0 + 2)),
                               CONCAT11(*(undefined1 *)
                                         (state.super_LodePNGState.info_raw._0_8_ +
                                         (ulong)(local_2b0 + 1)),
                                        *(undefined1 *)
                                         (state.super_LodePNGState.info_raw._0_8_ + (ulong)local_2b0
                                         ))));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_palette,
                   (value_type_conflict3 *)
                   ((long)&rgba_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      local_271 = '\x01';
      state.super_LodePNGState.encoder.text_compression = 6;
    }
    if (((state.super_LodePNGState.info_png.interlace_method == 2) ||
        (state.super_LodePNGState.info_png.interlace_method == 0)) ||
       (state.super_LodePNGState.info_png.interlace_method == 4)) {
      state.super_LodePNGState.encoder.text_compression = 6;
      local_271 = '\x01';
    }
    if (state.super_LodePNGState.info_png._12_4_ != 8) {
      state.super_LodePNGState.encoder._84_4_ = 8;
      local_271 = '\x01';
    }
    if (local_271 != '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_data);
      state.super_LodePNGState.decoder.ignore_critical = 1;
      uVar4 = lodepng::decode(&this->_data,&error,&local_38,(State *)local_270,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&h);
      if (uVar4 != 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar6 = lodepng_error_text(uVar4);
        std::runtime_error::runtime_error(prVar5,pcVar6);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    this->_width = error;
    this->_height = local_38;
    this->_src_coord_y = 0;
    this->_src_coord_x = 0;
    rgba_data((rgba_vec_t *)local_2d0,this);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0);
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_300,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (&this->_colors,&local_300);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_300)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d0);
    lodepng::State::~State((State *)local_270);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&h);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar6 = lodepng_error_text(uVar4);
  std::runtime_error::runtime_error(prVar5,pcVar6);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image::Image(const std::string& path) {
  byte_vec_t buffer;
  unsigned w, h;

  unsigned error = lodepng::load_file(buffer, path);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  lodepng::State state;
  state.decoder.color_convert = false;
  state.decoder.ignore_crc = true;

  error = lodepng::decode(_data, w, h, state, buffer);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));

  bool needs_conversion = false;

  if (state.info_raw.colortype == LCT_PALETTE) {
    if (state.info_raw.bitdepth && state.info_raw.bitdepth < 8) {
      // unpack 2/4 bit data
      _indexed_data = index_vec_t(w * h);
      unsigned depth = state.info_raw.bitdepth;
      unsigned ppb = 8 / state.info_raw.bitdepth;
      index_t mask = 0;
      for (unsigned i = 0; i < depth; ++i)
        mask = (mask << 1) + 1;

      for (unsigned i = 0; i < _indexed_data.size(); ++i) {
        unsigned pack_shift = 8 - depth - ((i * depth) % 8);
        _indexed_data[i] = mask & (_data[i / ppb] >> pack_shift);
      }

    } else {
      _indexed_data = _data;
    }

    for (unsigned i = 0; i < state.info_raw.palettesize * 4; i += 4) {
      uint32_t color = (state.info_raw.palette[i]) + (state.info_raw.palette[i + 1] << 8) +
                       (state.info_raw.palette[i + 2] << 16) + (state.info_raw.palette[i + 3] << 24);
      _palette.push_back(color);
    }

    needs_conversion = true;
    state.info_raw.colortype = LCT_RGBA;
  }

  if (state.info_png.color.colortype == LCT_RGB || state.info_png.color.colortype == LCT_GREY ||
      state.info_png.color.colortype == LCT_GREY_ALPHA) {
    state.info_raw.colortype = LCT_RGBA;
    needs_conversion = true;
  }

  if (state.info_png.color.bitdepth != 8) {
    state.info_raw.bitdepth = 8;
    needs_conversion = true;
  }

  if (needs_conversion) {
    _data.clear();
    state.decoder.color_convert = true;
    error = lodepng::decode(_data, w, h, state, buffer);
    if (error)
      throw std::runtime_error(lodepng_error_text(error));
  }

  _width = w;
  _height = h;

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}